

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O1

int __thiscall
CVmObjTads::getp_create_clone(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  long *plVar8;
  undefined2 *puVar9;
  short sVar10;
  
  if (getp_create_clone(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_create_clone();
  }
  pcVar2 = (this->super_CVmObject).ext_;
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_create_clone::desc);
  if (iVar3 == 0) {
    vVar4 = create(0,*(ushort *)((this->super_CVmObject).ext_ + 0x24),*(ushort *)(pcVar2 + 0x22));
    pcVar7 = (this->super_CVmObject).ext_;
    plVar8 = (long *)((long)&G_obj_table_X.pages_[vVar4 >> 0xc]->ptr_ +
                     (ulong)((vVar4 & 0xfff) * 0x18));
    if (*(short *)(pcVar7 + 0x24) != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar1 = *(uint *)(pcVar7 + lVar5 + 0x28);
        *(uint *)(plVar8[1] + 0x28 + lVar5) = uVar1;
        *(char **)(plVar8[1] + 0x30 + lVar5) =
             (G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_).obj_ + (uVar1 & 0xfff) * 0x18;
        uVar6 = uVar6 + 1;
        pcVar7 = (this->super_CVmObject).ext_;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 < *(ushort *)(pcVar7 + 0x24));
    }
    sVar10 = *(short *)(pcVar2 + 0x22);
    if (sVar10 != 0) {
      puVar9 = *(undefined2 **)(pcVar2 + 0x18);
      do {
        (**(code **)(*plVar8 + 0x60))(plVar8,0,self,*puVar9,puVar9 + 0xc);
        puVar9 = puVar9 + 0x14;
        sVar10 = sVar10 + -1;
      } while (sVar10 != 0);
    }
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar4;
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_create_clone(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);
    vm_obj_id_t new_obj;
    CVmObjTads *tobj;
    vm_tadsobj_prop *entry;
    ushort i;
    vm_tadsobj_hdr *hdr = get_hdr();

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   create a new object with the same number of superclasses as I have,
     *   and with space for all of my properties 
     */
    new_obj = create(vmg_ FALSE, get_sc_count(), hdr->prop_entry_free);
    tobj = (CVmObjTads *)vm_objp(vmg_ new_obj);

    /* copy my superclass list to the new object */
    for (i = 0 ; i < get_sc_count() ; ++i)
        tobj->set_sc(vmg_ i, get_sc(i));

    /* copy my properties to the new object */
    for (i = hdr->prop_entry_free, entry = hdr->prop_entry_arr ;
         i != 0 ; --i, ++entry)
    {
        /* 
         *   Store the property in the new object.  We don't need to store
         *   undo for the property, as the object is entirely new since the
         *   last savepoint (as there can't have been a savepoint while we've
         *   been working, obviously).
         */
        tobj->set_prop(vmg_ 0, self, entry->prop, &entry->val);
    }

    /* the return value is the new object ID */
    retval->set_obj(new_obj);

    /* handled */
    return TRUE;
}